

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O2

size_t score(decks_t *result,size_t p1,size_t p2)

{
  mapped_type *pmVar1;
  size_t sVar2;
  _Map_pointer ppuVar3;
  _Elt_pointer puVar4;
  long lVar5;
  _Elt_pointer puVar6;
  _Elt_pointer puVar7;
  size_t p1_local;
  size_t winner;
  
  p1_local = p1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)result,&p1_local);
  if ((pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    p2 = p1_local;
  }
  winner = p2;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)result,&winner);
  puVar4 = (pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  ppuVar3 = (pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Deque_impl_data._M_finish._M_node;
  lVar5 = 1;
  sVar2 = 0;
  for (puVar6 = (pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      puVar6 != (pmVar1->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur; puVar6 = puVar6 + -1) {
    puVar7 = puVar6;
    if (puVar6 == puVar4) {
      puVar7 = ppuVar3[-1] + 0x40;
      puVar4 = ppuVar3[-1];
      ppuVar3 = ppuVar3 + -1;
      puVar6 = puVar4 + 0x40;
    }
    sVar2 = sVar2 + puVar7[-1] * lVar5;
    lVar5 = lVar5 + 1;
  }
  return sVar2;
}

Assistant:

size_t score(decks_t result, size_t p1, size_t p2) {
  auto winner = result.at(p1).cards.empty() ? p2 : p1;
  const auto& winner_deck = result.at(winner).cards;

  auto i = 1;
  return std::accumulate(winner_deck.crbegin(), winner_deck.crend(), uint64_t{0}, [&i](auto a, auto v){
    return a + v * (i++);
  });
}